

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

bool deqp::egl::Image::isCompatibleCreateAndModifyActions(Action *create,Action *modify)

{
  GLenum createFormat;
  long lVar1;
  long lVar2;
  byte unaff_R15B;
  
  lVar1 = __dynamic_cast(create,&Action::typeinfo,&GLES2ImageApi::Create::typeinfo,0);
  if (lVar1 == 0) goto LAB_00e79500;
  createFormat = (**(code **)(**(long **)(lVar1 + 8) + 0x28))();
  lVar2 = __dynamic_cast(modify,&Action::typeinfo,&GLES2ImageApi::ModifyTexSubImage::typeinfo,0);
  if (lVar2 != 0) {
    unaff_R15B = isCompatibleFormats(createFormat,*(GLenum *)(lVar2 + 8),*(GLenum *)(lVar2 + 0xc));
    goto LAB_00e79500;
  }
  lVar2 = __dynamic_cast(modify,&Action::typeinfo,
                         &GLES2ImageApi::ModifyRenderbufferClearColor::typeinfo,0);
  if ((lVar2 != 0) && ((unaff_R15B = 0, createFormat == 0x81a5 || (createFormat == 0x8d48))))
  goto LAB_00e79500;
  lVar2 = __dynamic_cast(modify,&Action::typeinfo,
                         &GLES2ImageApi::ModifyRenderbufferClearDepth::typeinfo,0);
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(modify,&Action::typeinfo,
                           &GLES2ImageApi::ModifyRenderbufferClearStencil::typeinfo,0);
    if (createFormat != 0x8d48) goto LAB_00e795a9;
  }
  else {
    if (createFormat != 0x81a5) {
      unaff_R15B = 0;
      goto LAB_00e79500;
    }
    lVar2 = __dynamic_cast(modify,&Action::typeinfo,
                           &GLES2ImageApi::ModifyRenderbufferClearStencil::typeinfo,0);
LAB_00e795a9:
    unaff_R15B = 0;
    if (lVar2 != 0) goto LAB_00e79500;
  }
  unaff_R15B = 1;
LAB_00e79500:
  return (bool)(lVar1 != 0 & unaff_R15B);
}

Assistant:

bool isCompatibleCreateAndModifyActions (const Action& create, const Action& modify)
{
	if (const GLES2ImageApi::Create* gles2Create = dynamic_cast<const GLES2ImageApi::Create*>(&create))
	{
		const GLenum createFormat = gles2Create->getEffectiveFormat();

		if (const GLES2ImageApi::ModifyTexSubImage* gles2TexSubImageModify = dynamic_cast<const GLES2ImageApi::ModifyTexSubImage*>(&modify))
		{
			const GLenum modifyFormat	= gles2TexSubImageModify->getFormat();
			const GLenum modifyType		= gles2TexSubImageModify->getType();

			return isCompatibleFormats(createFormat, modifyFormat, modifyType);
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearColor*>(&modify))
		{
			// reintepreting color as non-color is not meaningful
			if (isDepthFormat(createFormat) || isStencilFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearDepth*>(&modify))
		{
			// reintepreting depth as non-depth is not meaningful
			if (!isDepthFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearStencil*>(&modify))
		{
			// reintepreting stencil as non-stencil is not meaningful
			if (!isStencilFormat(createFormat))
				return false;
		}

		return true;
	}
	else
		DE_ASSERT(false);

	return false;
}